

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlDumpElementContent(xmlBufferPtr buf,xmlElementContentPtr content)

{
  xmlElementContentType xVar1;
  _xmlElementContent *p_Var2;
  uint uVar3;
  char *string;
  xmlElementContentPtr pxVar4;
  _xmlElementContent **pp_Var5;
  bool bVar6;
  
  if (content != (xmlElementContentPtr)0x0) {
    xmlBufferWriteChar(buf,"(");
    pxVar4 = content;
    do {
      if (pxVar4 == (xmlElementContentPtr)0x0) {
        return;
      }
      xVar1 = pxVar4->type;
      if (xVar1 - XML_ELEMENT_CONTENT_SEQ < 2) {
        if (((pxVar4 != content) && (pxVar4->parent != (_xmlElementContent *)0x0)) &&
           ((xVar1 != pxVar4->parent->type || (pxVar4->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
          xmlBufferWriteChar(buf,"(");
        }
        pp_Var5 = &pxVar4->c1;
      }
      else {
        if (xVar1 == XML_ELEMENT_CONTENT_ELEMENT) {
          if (pxVar4->prefix != (xmlChar *)0x0) {
            xmlBufferWriteCHAR(buf,pxVar4->prefix);
            xmlBufferWriteChar(buf,":");
          }
          xmlBufferWriteCHAR(buf,pxVar4->name);
        }
        else if (xVar1 == XML_ELEMENT_CONTENT_PCDATA) {
          xmlBufferWriteChar(buf,"#PCDATA");
        }
        else {
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,
                          (char *)0x0,(char *)0x0,0,0,"%s",
                          "Internal: ELEMENT cur corrupted invalid type\n");
        }
        do {
          if (pxVar4 == content) goto LAB_0018e4bd;
          p_Var2 = pxVar4->parent;
          if (p_Var2 == (_xmlElementContent *)0x0) {
            return;
          }
          if ((pxVar4->type - XML_ELEMENT_CONTENT_SEQ < 2) &&
             ((pxVar4->type != p_Var2->type || (pxVar4->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
            xmlBufferWriteChar(buf,")");
          }
          uVar3 = pxVar4->ocur - XML_ELEMENT_CONTENT_OPT;
          if (uVar3 < 3) {
            xmlBufferWriteChar(buf,*(char **)(&DAT_0022eb28 + (ulong)uVar3 * 8));
          }
          bVar6 = pxVar4 != p_Var2->c1;
          pxVar4 = p_Var2;
        } while (bVar6);
        string = " , ";
        if (p_Var2->type == XML_ELEMENT_CONTENT_SEQ) {
LAB_0018e4ab:
          xmlBufferWriteChar(buf,string);
        }
        else if (p_Var2->type == XML_ELEMENT_CONTENT_OR) {
          string = " | ";
          goto LAB_0018e4ab;
        }
        pp_Var5 = &p_Var2->c2;
      }
      pxVar4 = *pp_Var5;
LAB_0018e4bd:
    } while (pxVar4 != content);
    xmlBufferWriteChar(buf,")");
    uVar3 = content->ocur - XML_ELEMENT_CONTENT_OPT;
    if (uVar3 < 3) {
      xmlBufferWriteChar(buf,*(char **)(&DAT_0022eb28 + (ulong)uVar3 * 8));
      return;
    }
  }
  return;
}

Assistant:

static void
xmlDumpElementContent(xmlBufferPtr buf, xmlElementContentPtr content) {
    xmlElementContentPtr cur;

    if (content == NULL) return;

    xmlBufferWriteChar(buf, "(");
    cur = content;

    do {
        if (cur == NULL) return;

        switch (cur->type) {
            case XML_ELEMENT_CONTENT_PCDATA:
                xmlBufferWriteChar(buf, "#PCDATA");
                break;
            case XML_ELEMENT_CONTENT_ELEMENT:
                if (cur->prefix != NULL) {
                    xmlBufferWriteCHAR(buf, cur->prefix);
                    xmlBufferWriteChar(buf, ":");
                }
                xmlBufferWriteCHAR(buf, cur->name);
                break;
            case XML_ELEMENT_CONTENT_SEQ:
            case XML_ELEMENT_CONTENT_OR:
                if ((cur != content) &&
                    (cur->parent != NULL) &&
                    ((cur->type != cur->parent->type) ||
                     (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                    xmlBufferWriteChar(buf, "(");
                cur = cur->c1;
                continue;
            default:
                xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
                        "Internal: ELEMENT cur corrupted invalid type\n",
                        NULL);
        }

        while (cur != content) {
            xmlElementContentPtr parent = cur->parent;

            if (parent == NULL) return;

            if (((cur->type == XML_ELEMENT_CONTENT_OR) ||
                 (cur->type == XML_ELEMENT_CONTENT_SEQ)) &&
                ((cur->type != parent->type) ||
                 (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                xmlBufferWriteChar(buf, ")");
            xmlDumpElementOccur(buf, cur);

            if (cur == parent->c1) {
                if (parent->type == XML_ELEMENT_CONTENT_SEQ)
                    xmlBufferWriteChar(buf, " , ");
                else if (parent->type == XML_ELEMENT_CONTENT_OR)
                    xmlBufferWriteChar(buf, " | ");

                cur = parent->c2;
                break;
            }

            cur = parent;
        }
    } while (cur != content);

    xmlBufferWriteChar(buf, ")");
    xmlDumpElementOccur(buf, content);
}